

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  int *piVar1;
  undefined8 *puVar2;
  float fVar3;
  undefined8 uVar4;
  int iVar5;
  float fVar6;
  ImVec4 *pIVar7;
  ImDrawChannel *__dest;
  long lVar8;
  void *pvVar9;
  ImGuiContext *pIVar10;
  long lVar11;
  char *__function;
  long lVar12;
  ImDrawChannel *pIVar13;
  void *pvVar14;
  void *pvVar15;
  int iVar16;
  ulong uVar17;
  
  pIVar10 = GImGui;
  if ((this->_ChannelsCurrent != 0) || (this->_ChannelsCount != 1)) {
    __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x114,"void ImDrawList::ChannelsSplit(int)");
  }
  iVar5 = (this->_Channels).Size;
  iVar16 = iVar5;
  if (channels_count <= iVar5) goto LAB_0014b1d7;
  iVar16 = (this->_Channels).Capacity;
  if (iVar16 < channels_count) {
    if (iVar16 == 0) {
      iVar16 = 8;
    }
    else {
      iVar16 = iVar16 / 2 + iVar16;
    }
    if (iVar16 <= channels_count) {
      iVar16 = channels_count;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImDrawChannel *)(*(pIVar10->IO).MemAllocFn)((long)iVar16 << 5);
    pIVar13 = (this->_Channels).Data;
    if (pIVar13 == (ImDrawChannel *)0x0) {
LAB_0014b1b9:
      pIVar13 = (ImDrawChannel *)0x0;
      pIVar10 = GImGui;
    }
    else {
      memcpy(__dest,pIVar13,(long)(this->_Channels).Size << 5);
      pIVar10 = GImGui;
      pIVar13 = (this->_Channels).Data;
      if (pIVar13 == (ImDrawChannel *)0x0) goto LAB_0014b1b9;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar10->IO).MemFreeFn)(pIVar13);
    (this->_Channels).Data = __dest;
    (this->_Channels).Capacity = iVar16;
  }
  (this->_Channels).Size = channels_count;
  iVar16 = channels_count;
LAB_0014b1d7:
  this->_ChannelsCount = channels_count;
  if (iVar16 < 1) {
LAB_0014b4d8:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x353,"value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]")
    ;
  }
  pIVar13 = (this->_Channels).Data;
  (pIVar13->IdxBuffer).Size = 0;
  (pIVar13->IdxBuffer).Capacity = 0;
  (pIVar13->IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar13->CmdBuffer).Size = 0;
  (pIVar13->CmdBuffer).Capacity = 0;
  (pIVar13->CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar17 = 1;
    lVar12 = 0x38;
    do {
      pIVar10 = GImGui;
      lVar8 = (long)(this->_Channels).Size;
      if ((long)uVar17 < (long)iVar5) {
        if (lVar8 <= (long)uVar17) goto LAB_0014b4d8;
        pIVar13 = (this->_Channels).Data;
        if (*(int *)((long)pIVar13 + lVar12 + -0x14) < 0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pvVar9 = (*(pIVar10->IO).MemAllocFn)(0);
          pvVar14 = *(void **)((long)pIVar13 + lVar12 + -0x10);
          if (pvVar14 == (void *)0x0) {
LAB_0014b2b5:
            pvVar14 = (void *)0x0;
            pIVar10 = GImGui;
          }
          else {
            memcpy(pvVar9,pvVar14,(long)*(int *)((long)pIVar13 + lVar12 + -0x18) * 0x30);
            pIVar10 = GImGui;
            pvVar14 = *(void **)((long)pIVar13 + lVar12 + -0x10);
            if (pvVar14 == (void *)0x0) goto LAB_0014b2b5;
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(pIVar10->IO).MemFreeFn)(pvVar14);
          *(void **)((long)pIVar13 + lVar12 + -0x10) = pvVar9;
          *(undefined4 *)((long)pIVar13 + lVar12 + -0x14) = 0;
          lVar8 = (long)(this->_Channels).Size;
        }
        *(undefined4 *)((long)pIVar13 + lVar12 + -0x18) = 0;
        pIVar10 = GImGui;
        if (lVar8 <= (long)uVar17) goto LAB_0014b4d8;
        pIVar13 = (this->_Channels).Data;
        if (*(int *)((long)pIVar13 + lVar12 + -4) < 0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pvVar9 = (*(pIVar10->IO).MemAllocFn)(0);
          pvVar14 = *(void **)((long)&(pIVar13->CmdBuffer).Size + lVar12);
          if (pvVar14 == (void *)0x0) {
LAB_0014b348:
            pvVar14 = (void *)0x0;
            pIVar10 = GImGui;
          }
          else {
            memcpy(pvVar9,pvVar14,(long)*(int *)((long)pIVar13 + lVar12 + -8) * 2);
            pIVar10 = GImGui;
            pvVar14 = *(void **)((long)&(pIVar13->CmdBuffer).Size + lVar12);
            if (pvVar14 == (void *)0x0) goto LAB_0014b348;
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(pIVar10->IO).MemFreeFn)(pvVar14);
          *(void **)((long)&(pIVar13->CmdBuffer).Size + lVar12) = pvVar9;
          *(undefined4 *)((long)pIVar13 + lVar12 + -4) = 0;
        }
        *(undefined4 *)((long)pIVar13 + lVar12 + -8) = 0;
      }
      else {
        if (lVar8 <= (long)uVar17) goto LAB_0014b4d8;
        pIVar13 = (this->_Channels).Data;
        puVar2 = (undefined8 *)((long)pIVar13 + lVar12 + -8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar13 + lVar12 + -0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      pIVar10 = GImGui;
      if ((long)(this->_Channels).Size <= (long)uVar17) goto LAB_0014b4d8;
      pIVar13 = (this->_Channels).Data;
      if (*(int *)((long)pIVar13 + lVar12 + -0x18) == 0) {
        lVar8 = (long)(this->_ClipRectStack).Size;
        if (lVar8 < 1) {
          __function = "value_type &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_0014b523:
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x35d,__function);
        }
        lVar11 = (long)(this->_TextureIdStack).Size;
        if (lVar11 < 1) {
          __function = "value_type &ImVector<void *>::back() [T = void *]";
          goto LAB_0014b523;
        }
        pIVar7 = (this->_ClipRectStack).Data;
        fVar6 = pIVar7[lVar8 + -1].x;
        uVar4 = *(undefined8 *)&pIVar7[lVar8 + -1].y;
        fVar3 = pIVar7[lVar8 + -1].w;
        pvVar14 = (this->_TextureIdStack).Data[lVar11 + -1];
        if (*(int *)((long)pIVar13 + lVar12 + -0x14) == 0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pvVar9 = (*(pIVar10->IO).MemAllocFn)(0x180);
          pvVar15 = *(void **)((long)pIVar13 + lVar12 + -0x10);
          if (pvVar15 == (void *)0x0) {
LAB_0014b44b:
            pvVar15 = (void *)0x0;
            pIVar10 = GImGui;
          }
          else {
            memcpy(pvVar9,pvVar15,(long)*(int *)((long)pIVar13 + lVar12 + -0x18) * 0x30);
            pIVar10 = GImGui;
            pvVar15 = *(void **)((long)pIVar13 + lVar12 + -0x10);
            if (pvVar15 == (void *)0x0) goto LAB_0014b44b;
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(pIVar10->IO).MemFreeFn)(pvVar15);
          *(void **)((long)pIVar13 + lVar12 + -0x10) = pvVar9;
          *(undefined4 *)((long)pIVar13 + lVar12 + -0x14) = 8;
          iVar16 = *(int *)((long)pIVar13 + lVar12 + -0x18);
        }
        else {
          pvVar9 = *(void **)((long)pIVar13 + lVar12 + -0x10);
          iVar16 = 0;
        }
        *(int *)((long)pIVar13 + lVar12 + -0x18) = iVar16 + 1;
        lVar8 = (long)iVar16 * 0x30;
        *(undefined4 *)((long)pvVar9 + lVar8) = 0;
        *(float *)((long)pvVar9 + lVar8 + 4) = fVar6;
        *(undefined8 *)((long)pvVar9 + lVar8 + 8) = uVar4;
        *(float *)((long)pvVar9 + lVar8 + 0x10) = fVar3;
        *(void **)((long)pvVar9 + lVar8 + 0x18) = pvVar14;
        puVar2 = (undefined8 *)((long)pvVar9 + lVar8 + 0x20);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      uVar17 = uVar17 + 1;
      lVar12 = lVar12 + 0x20;
    } while ((uint)channels_count != uVar17);
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}